

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O0

Vec_Wrd_t * Gia_ManSimRelDeriveFuncs(Gia_Man_t *p,Vec_Wrd_t *vRel,int nOuts)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Wrd_t *vFuncs_00;
  word *pwVar4;
  Vec_Wrd_t *vFuncs;
  int nWords;
  int nMints;
  int Count;
  int m;
  int k;
  int i;
  int nOuts_local;
  Vec_Wrd_t *vRel_local;
  Gia_Man_t *p_local;
  
  nWords = 0;
  iVar1 = 1 << ((byte)nOuts & 0x1f);
  iVar2 = Vec_WrdSize(vRel);
  iVar2 = iVar2 / iVar1;
  vFuncs_00 = Vec_WrdStart(nOuts * 2 * iVar2);
  iVar3 = Vec_WrdSize(vRel);
  if (iVar3 % iVar1 != 0) {
    __assert_fail("Vec_WrdSize(vRel) % nMints == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x31a,"Vec_Wrd_t *Gia_ManSimRelDeriveFuncs(Gia_Man_t *, Vec_Wrd_t *, int)");
  }
  m = 0;
  do {
    if (iVar2 * 0x40 <= m) {
      if (nWords == 0) {
        printf("The relation was successfully determized without don\'t-cares for %d patterns.\n",
               (ulong)(uint)(iVar2 << 6));
      }
      else {
        printf("The relation is not well-defined for %d (out of %d) patterns.\n",(ulong)(uint)nWords
               ,(ulong)(uint)(iVar2 << 6));
      }
      Gia_ManSimRelCheckFuncs(p,vRel,nOuts,vFuncs_00);
      return vFuncs_00;
    }
    for (nMints = 0; nMints < iVar1; nMints = nMints + 1) {
      pwVar4 = Vec_WrdArray(vRel);
      iVar3 = Abc_TtGetBit(pwVar4,m * iVar1 + nMints);
      if (iVar3 != 0) break;
    }
    nWords = (uint)(nMints == iVar1) + nWords;
    for (Count = 0; Count < nOuts; Count = Count + 1) {
      if ((nMints >> ((byte)Count & 0x1f) & 1U) == 0) {
        pwVar4 = Vec_WrdEntryP(vFuncs_00,Count * 2 * iVar2);
        Abc_TtSetBit(pwVar4,m);
      }
      else {
        pwVar4 = Vec_WrdEntryP(vFuncs_00,(Count * 2 + 1) * iVar2);
        Abc_TtSetBit(pwVar4,m);
      }
    }
    m = m + 1;
  } while( true );
}

Assistant:

Vec_Wrd_t * Gia_ManSimRelDeriveFuncs( Gia_Man_t * p, Vec_Wrd_t * vRel, int nOuts )
{
    int i, k, m, Count = 0, nMints = 1 << nOuts, nWords = Vec_WrdSize(vRel) / nMints;
    Vec_Wrd_t * vFuncs = Vec_WrdStart( 2 * nOuts * nWords );
    assert( Vec_WrdSize(vRel) % nMints == 0 );
    for ( i = 0; i < 64 * nWords; i++ )
    {
        for ( m = 0; m < nMints; m++ )
            if ( Abc_TtGetBit( Vec_WrdArray(vRel), i*nMints+m ) )
                break;
        Count += m == nMints;
        for ( k = 0; k < nOuts; k++ )
            if ( (m >> k) & 1 )
                Abc_TtSetBit( Vec_WrdEntryP(vFuncs, (2*k+1)*nWords), i );
            else
                Abc_TtSetBit( Vec_WrdEntryP(vFuncs, (2*k+0)*nWords), i );
    }
    if ( Count )
        printf( "The relation is not well-defined for %d (out of %d) patterns.\n", Count, 64 * nWords );
    else
        printf( "The relation was successfully determized without don't-cares for %d patterns.\n", 64 * nWords );
    Gia_ManSimRelCheckFuncs( p, vRel, nOuts, vFuncs );
    return vFuncs;
}